

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int aec_decode_count_offsets(aec_stream_conflict *strm,size_t *count)

{
  vector_t *vec;
  size_t sVar1;
  int iVar2;
  
  vec = strm->state->offsets;
  iVar2 = 0;
  if (vec == (vector_t *)0x0) {
    iVar2 = -5;
    sVar1 = 0;
  }
  else {
    sVar1 = vector_size(vec);
  }
  *count = sVar1;
  return iVar2;
}

Assistant:

int aec_decode_count_offsets(struct aec_stream *strm, size_t *count)
{
    struct internal_state *state = strm->state;
    if (state->offsets == NULL) {
        *count = 0;
        return AEC_RSI_OFFSETS_ERROR;
    } else {
        *count = vector_size(state->offsets);
    }
    return AEC_OK;
}